

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O1

shared_ptr<pstack::Dwarf::DIE::Raw> __thiscall
pstack::Dwarf::DIE::decode(DIE *this,Unit *unit,DIE *parent,Off offset)

{
  element_type *peVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined1 auVar4 [16];
  shared_ptr<pstack::Dwarf::DIE::Raw> sVar5;
  Off local_80;
  Unit *local_78;
  Unit *unit_local;
  size_t abbrev;
  DWARFReader r;
  element_type *peStack_38;
  undefined1 local_29;
  
  local_78 = unit;
  Elf::Section::io((Section *)&r.addrLen);
  abbrev = offset;
  r.off = (**(code **)(*(long *)r._32_8_ + 0x40))();
  uVar2 = r._32_8_;
  r.end = r._32_8_;
  r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_38;
  r.addrLen = 0;
  r._36_4_ = 0;
  r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
       = 8;
  auVar4 = (**(code **)(*(long *)uVar2 + 0x18))(uVar2,abbrev);
  unit_local = auVar4._0_8_;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auVar4._8_8_ + abbrev);
  abbrev = (size_t)_Var3._M_pi;
  if (unit_local == (Unit *)0x0) {
    peVar1 = (parent->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      peVar1->nextSibling = (Off)_Var3._M_pi;
    }
    this->offset = 0;
    (this->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_80 = parent->offset;
    this->offset = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstack::Dwarf::DIE::Raw,std::allocator<pstack::Dwarf::DIE::Raw>,pstack::Dwarf::Unit*&,pstack::Dwarf::DWARFReader&,unsigned_long&,unsigned_long>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->raw,(Raw **)this,
               (allocator<pstack::Dwarf::DIE::Raw> *)&local_29,&local_78,(DWARFReader *)&abbrev,
               (unsigned_long *)&unit_local,&local_80);
    _Var3._M_pi = extraout_RDX;
  }
  if (r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Dwarf::DIE::Raw>)
         sVar5.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DIE::Raw>
DIE::decode(Unit *unit, const DIE &parent, Elf::Off offset)
{
    DWARFReader r(unit->dwarf->debugInfo.io(), offset);
    size_t abbrev = r.getuleb128();
    if (abbrev == 0) {
        // If we get to the terminator, then we now know the parent's nextSibling:
        // update it now.
        if (parent)
            parent.raw->nextSibling = r.getOffset();
        return nullptr;
    }
    return std::make_shared<DIE::Raw>(unit, r, abbrev, parent.getOffset());
}